

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

bool __thiscall QCalendarWidget::eventFilter(QCalendarWidget *this,QObject *watched,QEvent *event)

{
  QCalendarWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  bool bVar2;
  undefined1 uVar3;
  char cVar4;
  QWidget *parent;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 auVar7 [16];
  QPoint local_58;
  QPoint local_50;
  int local_48;
  int local_44;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 2) {
    this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
    bVar2 = QWidget::hasFocus((QWidget *)this_00->yearEdit);
    if (!bVar2) goto LAB_003cd1cd;
    parent = QWidget::window(&this->super_QWidget);
    if ((watched == (QObject *)0x0) || ((*(byte *)(*(long *)(watched + 8) + 0x30) & 1) == 0)) {
LAB_003cd092:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
        return (bool)uVar3;
      }
      goto LAB_003cd218;
    }
    pQVar5 = QWidget::window((QWidget *)watched);
    if (pQVar5 != parent) goto LAB_003cd092;
    auVar7 = QEventPoint::position();
    dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
    bVar2 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_50.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar6);
    dVar6 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
    bVar2 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_50.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar6);
    local_40 = QWidget::mapTo((QWidget *)watched,parent,&local_50);
    local_58.xp.m_i = 0;
    local_58.yp.m_i = 0;
    local_50 = QWidget::mapTo((QWidget *)this_00->yearEdit,parent,&local_58);
    pQVar1 = (this_00->yearEdit->super_QAbstractSpinBox).super_QWidget.data;
    local_48 = ((pQVar1->crect).x2.m_i + local_50.xp.m_i.m_i) - (pQVar1->crect).x1.m_i;
    local_44 = ((pQVar1->crect).y2.m_i + local_50.yp.m_i.m_i) - (pQVar1->crect).y1.m_i;
    cVar4 = QRect::contains(&local_50,SUB81(&local_40,0));
    if (cVar4 != '\0') goto LAB_003cd1cd;
    event[0xc] = (QEvent)0x1;
    QCalendarWidgetPrivate::_q_yearEditingFinished(this_00);
    QWidget::setFocus(&this->super_QWidget,OtherFocusReason);
    uVar3 = 1;
  }
  else {
LAB_003cd1cd:
    uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar3;
  }
LAB_003cd218:
  __stack_chk_fail();
}

Assistant:

bool QCalendarWidget::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QCalendarWidget);
    if (event->type() == QEvent::MouseButtonPress && d->yearEdit->hasFocus()) {
        // We can get filtered press events that were intended for Qt Virtual Keyboard's
        // input panel (QQuickView), so we have to make sure that the window is indeed a QWidget - no static_cast.
        // In addition, as we have a event filter on the whole application we first make sure that the top level widget
        // of both this and the watched widget are the same to decide if we should finish the year edition.
        QWidget *tlw = window();
        QWidget *widget = qobject_cast<QWidget *>(watched);
        if (!widget || widget->window() != tlw)
            return QWidget::eventFilter(watched, event);

        QPoint mousePos = widget->mapTo(tlw, static_cast<QMouseEvent *>(event)->position().toPoint());
        QRect geom = QRect(d->yearEdit->mapTo(tlw, QPoint(0, 0)), d->yearEdit->size());
        if (!geom.contains(mousePos)) {
            event->accept();
            d->_q_yearEditingFinished();
            setFocus();
            return true;
        }
    }
    return QWidget::eventFilter(watched, event);
}